

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O1

Vector3fi * __thiscall
pbrt::Transform::operator()(Vector3fi *__return_storage_ptr__,Transform *this,Vector3fi *v)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  Tuple3<pbrt::Vector3,_float> local_20;
  Vector3f local_14;
  
  fVar1 = (v->super_Vector3<pbrt::Interval<float>_>).
          super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.x.low;
  uVar3 = *(ulong *)&(v->super_Vector3<pbrt::Interval<float>_>).
                     super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.x.high;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar3;
  auVar12 = vinsertps_avx(ZEXT416((uint)fVar1),
                          ZEXT416((uint)(v->super_Vector3<pbrt::Interval<float>_>).
                                        super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.y.high),
                          0x10);
  auVar14._0_4_ = (float)uVar3 + auVar12._0_4_;
  auVar14._4_4_ = (float)(uVar3 >> 0x20) + auVar12._4_4_;
  auVar14._8_4_ = auVar12._8_4_ + 0.0;
  auVar14._12_4_ = auVar12._12_4_ + 0.0;
  auVar12._8_4_ = 0x3f000000;
  auVar12._0_8_ = 0x3f0000003f000000;
  auVar12._12_4_ = 0x3f000000;
  auVar11 = vmulps_avx512vl(auVar14,auVar12);
  fVar2 = (v->super_Vector3<pbrt::Interval<float>_>).
          super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.z.low;
  fVar7 = (fVar2 + (v->super_Vector3<pbrt::Interval<float>_>).
                   super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.z.high) * 0.5;
  fVar1 = (float)uVar3 - fVar1;
  auVar12 = vmovshdup_avx(auVar11);
  auVar14 = vmovshdup_avx(auVar15);
  fVar13 = auVar11._0_4_;
  fVar16 = auVar12._0_4_;
  if ((((fVar1 != 0.0) ||
       (fVar9 = (v->super_Vector3<pbrt::Interval<float>_>).
                super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.y.high - auVar14._0_4_,
       fVar9 != 0.0)) || (NAN(fVar9))) ||
     ((fVar9 = (v->super_Vector3<pbrt::Interval<float>_>).
               super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.z.high - fVar2, fVar9 != 0.0 ||
      (NAN(fVar9))))) {
    fVar1 = fVar1 * 0.5;
    fVar9 = ((v->super_Vector3<pbrt::Interval<float>_>).
             super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.y.high - auVar14._0_4_) * 0.5;
    fVar8 = ((v->super_Vector3<pbrt::Interval<float>_>).
             super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.z.high - fVar2) * 0.5;
    auVar5 = vinsertps_avx((undefined1  [16])(this->m).m[0],ZEXT416((uint)(this->m).m[1][0]),0x10);
    auVar29._8_4_ = 0x7fffffff;
    auVar29._0_8_ = 0x7fffffff7fffffff;
    auVar29._12_4_ = 0x7fffffff;
    auVar14 = vandps_avx(auVar29,auVar5);
    auVar6 = vinsertps_avx(*(undefined1 (*) [16])((this->m).m[0] + 1),
                           ZEXT416((uint)(this->m).m[1][1]),0x10);
    auVar15 = vandps_avx(auVar29,auVar6);
    auVar30._0_4_ = fVar9 * auVar15._0_4_;
    auVar30._4_4_ = fVar9 * auVar15._4_4_;
    auVar30._8_4_ = fVar9 * auVar15._8_4_;
    auVar30._12_4_ = fVar9 * auVar15._12_4_;
    auVar32._4_4_ = fVar1;
    auVar32._0_4_ = fVar1;
    auVar32._8_4_ = fVar1;
    auVar32._12_4_ = fVar1;
    auVar22 = vfmadd213ps_fma(auVar32,auVar14,auVar30);
    auVar15 = vinsertps_avx(*(undefined1 (*) [16])((this->m).m[0] + 2),
                            ZEXT416((uint)(this->m).m[1][2]),0x10);
    auVar14 = vandps_avx(auVar15,auVar29);
    auVar31._4_4_ = fVar8;
    auVar31._0_4_ = fVar8;
    auVar31._8_4_ = fVar8;
    auVar31._12_4_ = fVar8;
    auVar22 = vfmadd213ps_fma(auVar31,auVar14,auVar22);
    auVar24._0_4_ = fVar13 * auVar5._0_4_;
    auVar24._4_4_ = fVar13 * auVar5._4_4_;
    auVar24._8_4_ = fVar13 * auVar5._8_4_;
    auVar24._12_4_ = fVar13 * auVar5._12_4_;
    auVar14 = vandps_avx(auVar29,auVar24);
    auVar26._0_4_ = fVar16 * auVar6._0_4_;
    auVar26._4_4_ = auVar12._4_4_ * auVar6._4_4_;
    auVar26._8_4_ = auVar12._8_4_ * auVar6._8_4_;
    auVar26._12_4_ = auVar12._12_4_ * auVar6._12_4_;
    auVar12 = vandps_avx(auVar29,auVar26);
    auVar27._0_4_ = auVar15._0_4_ * fVar7;
    auVar27._4_4_ = auVar15._4_4_ * fVar7;
    auVar27._8_4_ = auVar15._8_4_ * fVar7;
    auVar27._12_4_ = auVar15._12_4_ * fVar7;
    auVar15 = vandps_avx(auVar29,auVar27);
    auVar25._0_4_ = auVar14._0_4_ + auVar12._0_4_ + auVar15._0_4_;
    auVar25._4_4_ = auVar14._4_4_ + auVar12._4_4_ + auVar15._4_4_;
    auVar25._8_4_ = auVar14._8_4_ + auVar12._8_4_ + auVar15._8_4_;
    auVar25._12_4_ = auVar14._12_4_ + auVar12._12_4_ + auVar15._12_4_;
    auVar5._8_4_ = 0x34400002;
    auVar5._0_8_ = 0x3440000234400002;
    auVar5._12_4_ = 0x34400002;
    auVar12 = vmulps_avx512vl(auVar25,auVar5);
    auVar6._8_4_ = 0x3f800002;
    auVar6._0_8_ = 0x3f8000023f800002;
    auVar6._12_4_ = 0x3f800002;
    auVar12 = vfmadd231ps_avx512vl(auVar12,auVar22,auVar6);
    local_20._0_8_ = vmovlps_avx(auVar12);
    fVar2 = (this->m).m[2][2];
    auVar12 = vandps_avx(auVar29,ZEXT416((uint)fVar2));
    uVar3 = *(ulong *)(this->m).m[2];
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar3;
    auVar14 = vandps_avx(auVar28,auVar29);
    auVar15 = vmovshdup_avx(auVar28);
    auVar15 = vandps_avx(auVar15,auVar29);
    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(auVar15._0_4_ * fVar9)),ZEXT416((uint)fVar1),auVar14);
    auVar22._0_4_ = (float)uVar3 * fVar13;
    auVar22._4_4_ = (float)(uVar3 >> 0x20) * auVar11._4_4_;
    auVar22._8_4_ = auVar11._8_4_ * 0.0;
    auVar22._12_4_ = auVar11._12_4_ * 0.0;
    auVar14 = vandps_avx(auVar29,auVar22);
    auVar14 = vhaddps_avx(auVar14,auVar14);
    auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar8),auVar12);
    auVar12 = vandps_avx(auVar29,ZEXT416((uint)(fVar7 * fVar2)));
    auVar12 = vfmadd231ss_fma(ZEXT416((uint)((auVar14._0_4_ + auVar12._0_4_) * 1.7881396e-07)),
                              auVar15,ZEXT416(0x3f800002));
    local_20.z = auVar12._0_4_;
  }
  else {
    auVar14 = vinsertps_avx((undefined1  [16])(this->m).m[0],ZEXT416((uint)(this->m).m[1][0]),0x10);
    auVar17._0_4_ = fVar13 * auVar14._0_4_;
    auVar17._4_4_ = fVar13 * auVar14._4_4_;
    auVar17._8_4_ = fVar13 * auVar14._8_4_;
    auVar17._12_4_ = fVar13 * auVar14._12_4_;
    auVar23._8_4_ = 0x7fffffff;
    auVar23._0_8_ = 0x7fffffff7fffffff;
    auVar23._12_4_ = 0x7fffffff;
    auVar14 = vandps_avx(auVar17,auVar23);
    auVar15 = vinsertps_avx(*(undefined1 (*) [16])((this->m).m[0] + 1),
                            ZEXT416((uint)(this->m).m[1][1]),0x10);
    auVar20._0_4_ = fVar16 * auVar15._0_4_;
    auVar20._4_4_ = auVar12._4_4_ * auVar15._4_4_;
    auVar20._8_4_ = auVar12._8_4_ * auVar15._8_4_;
    auVar20._12_4_ = auVar12._12_4_ * auVar15._12_4_;
    auVar12 = vandps_avx(auVar20,auVar23);
    auVar15 = vinsertps_avx(*(undefined1 (*) [16])((this->m).m[0] + 2),
                            ZEXT416((uint)(this->m).m[1][2]),0x10);
    auVar21._0_4_ = fVar7 * auVar15._0_4_;
    auVar21._4_4_ = fVar7 * auVar15._4_4_;
    auVar21._8_4_ = fVar7 * auVar15._8_4_;
    auVar21._12_4_ = fVar7 * auVar15._12_4_;
    auVar15 = vandps_avx(auVar21,auVar23);
    auVar18._0_4_ = auVar14._0_4_ + auVar12._0_4_ + auVar15._0_4_;
    auVar18._4_4_ = auVar14._4_4_ + auVar12._4_4_ + auVar15._4_4_;
    auVar18._8_4_ = auVar14._8_4_ + auVar12._8_4_ + auVar15._8_4_;
    auVar18._12_4_ = auVar14._12_4_ + auVar12._12_4_ + auVar15._12_4_;
    auVar10._8_4_ = 0x34400002;
    auVar10._0_8_ = 0x3440000234400002;
    auVar10._12_4_ = 0x34400002;
    auVar12 = vmulps_avx512vl(auVar18,auVar10);
    local_20._0_8_ = vmovlps_avx(auVar12);
    uVar4 = *(undefined8 *)(this->m).m[2];
    auVar19._0_4_ = fVar13 * (float)uVar4;
    auVar19._4_4_ = auVar11._4_4_ * (float)((ulong)uVar4 >> 0x20);
    auVar19._8_4_ = auVar11._8_4_ * 0.0;
    auVar19._12_4_ = auVar11._12_4_ * 0.0;
    auVar12 = vandps_avx(auVar19,auVar23);
    auVar14 = vhaddps_avx(auVar12,auVar12);
    auVar12 = vandps_avx(ZEXT416((uint)(fVar7 * (this->m).m[2][2])),auVar23);
    local_20.z = (auVar14._0_4_ + auVar12._0_4_) * 1.7881396e-07;
  }
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar16 * (this->m).m[0][1])),auVar11,
                            ZEXT416((uint)(this->m).m[0][0]));
  auVar15 = ZEXT416((uint)fVar7);
  auVar12 = vfmadd231ss_fma(auVar12,auVar15,ZEXT416((uint)(this->m).m[0][2]));
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar16 * (this->m).m[1][1])),auVar11,
                            ZEXT416((uint)(this->m).m[1][0]));
  auVar14 = vfmadd231ss_fma(auVar14,auVar15,ZEXT416((uint)(this->m).m[1][2]));
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar16 * (this->m).m[2][1])),auVar11,
                            ZEXT416((uint)(this->m).m[2][0]));
  auVar11 = vfmadd231ss_fma(auVar11,auVar15,ZEXT416((uint)(this->m).m[2][2]));
  local_14.super_Tuple3<pbrt::Vector3,_float>.x = auVar12._0_4_;
  local_14.super_Tuple3<pbrt::Vector3,_float>.y = auVar14._0_4_;
  local_14.super_Tuple3<pbrt::Vector3,_float>.z = auVar11._0_4_;
  Vector3fi::Vector3fi(__return_storage_ptr__,&local_14,(Vector3f *)&local_20);
  return __return_storage_ptr__;
}

Assistant:

inline Vector3fi Transform::operator()(const Vector3fi &v) const {
    Float x = Float(v.x), y = Float(v.y), z = Float(v.z);
    Vector3f vOutError;
    if (v.IsExact()) {
        vOutError.x = gamma(3) * (std::abs(m[0][0] * x) + std::abs(m[0][1] * y) +
                                  std::abs(m[0][2] * z));
        vOutError.y = gamma(3) * (std::abs(m[1][0] * x) + std::abs(m[1][1] * y) +
                                  std::abs(m[1][2] * z));
        vOutError.z = gamma(3) * (std::abs(m[2][0] * x) + std::abs(m[2][1] * y) +
                                  std::abs(m[2][2] * z));
    } else {
        Vector3f vInError = v.Error();
        vOutError.x = (gamma(3) + 1) * (std::abs(m[0][0]) * vInError.x +
                                        std::abs(m[0][1]) * vInError.y +
                                        std::abs(m[0][2]) * vInError.z) +
                      gamma(3) * (std::abs(m[0][0] * x) + std::abs(m[0][1] * y) +
                                  std::abs(m[0][2] * z));
        vOutError.y = (gamma(3) + 1) * (std::abs(m[1][0]) * vInError.x +
                                        std::abs(m[1][1]) * vInError.y +
                                        std::abs(m[1][2]) * vInError.z) +
                      gamma(3) * (std::abs(m[1][0] * x) + std::abs(m[1][1] * y) +
                                  std::abs(m[1][2] * z));
        vOutError.z = (gamma(3) + 1) * (std::abs(m[2][0]) * vInError.x +
                                        std::abs(m[2][1]) * vInError.y +
                                        std::abs(m[2][2]) * vInError.z) +
                      gamma(3) * (std::abs(m[2][0] * x) + std::abs(m[2][1] * y) +
                                  std::abs(m[2][2] * z));
    }

    Float xp = m[0][0] * x + m[0][1] * y + m[0][2] * z;
    Float yp = m[1][0] * x + m[1][1] * y + m[1][2] * z;
    Float zp = m[2][0] * x + m[2][1] * y + m[2][2] * z;

    return Vector3fi(Vector3f(xp, yp, zp), vOutError);
}